

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedNegative.cpp
# Opt level: O2

bool __thiscall
glcts::DrawBuffersIndexedNegative::ExpectedError
          (DrawBuffersIndexedNegative *this,GLenum expectedResult,char *call)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expectedResult) {
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Error on ");
    std::operator<<((ostream *)this_00,call);
    std::operator<<((ostream *)this_00," call.\n");
    std::operator<<((ostream *)this_00,"Expected ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," but found ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return GVar2 == expectedResult;
}

Assistant:

bool DrawBuffersIndexedNegative::ExpectedError(glw::GLenum expectedResult, const char* call)
{
	glw::GLenum error = m_context.getRenderContext().getFunctions().getError();

	if (expectedResult != error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Error on " << call << " call.\n"
						   << "Expected " << expectedResult << " but found " << error << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}